

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

double __thiscall
FIX::double_conversion::Strtod(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  bool bVar1;
  uint64_t uVar2;
  Vector<const_char> buffer_00;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_01;
  DiyFp DVar3;
  DiyFp diy_fp;
  int *in_stack_fffffffffffffc10;
  Double *this_00;
  Double local_3e8;
  Double local_3e0;
  Double local_3d8;
  uint64_t local_3d0;
  int local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  int local_3ac;
  uint64_t uStack_3a8;
  int comparison;
  int local_3a0;
  Double local_398;
  uint64_t local_390;
  DiyFp upper_boundary;
  undefined4 local_378;
  double dStack_368;
  bool is_correct;
  double guess;
  undefined8 local_358;
  undefined1 local_34c [8];
  int updated_exponent;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  int exponent_local;
  Vector<const_char> buffer_local;
  
  buffer_00.length_ = buffer.length_;
  Vector<const_char>::Vector((Vector<const_char> *)(local_34c + 4));
  local_358 = CONCAT44(buffer_local.start_._4_4_,(uint)buffer.start_);
  buffer_00.start_ = (char *)(ulong)(uint)buffer.start_;
  buffer_00._12_4_ = 0;
  guess = (double)this;
  TrimAndCut(this,buffer_00,(int)&trimmed + 8,(char *)0x30c,(int)local_34c + 4,
             (Vector<const_char> *)local_34c,in_stack_fffffffffffffc10);
  upper_boundary._8_8_ = stack0xfffffffffffffcb8;
  local_378 = SUB84(trimmed.start_,0);
  trimmed_00.length_ = local_378;
  trimmed_00.start_ = (char *)stack0xfffffffffffffcb8;
  trimmed_00._12_4_ = 0;
  bVar1 = ComputeGuess(trimmed_00,local_34c._0_4_,&stack0xfffffffffffffc98);
  if (bVar1) {
    buffer_local._8_8_ = dStack_368;
  }
  else {
    this_00 = &local_398;
    Double::Double(this_00,dStack_368);
    DVar3 = Double::UpperBoundary(this_00);
    local_3d0 = DVar3.f_;
    local_3c8 = DVar3.e_;
    local_3c0 = stack0xfffffffffffffcb8;
    local_3b8 = SUB84(trimmed.start_,0);
    uStack_3b4 = (undefined4)((ulong)trimmed.start_ >> 0x20);
    buffer_01.length_ = local_3b8;
    buffer_01.start_ = (char *)stack0xfffffffffffffcb8;
    buffer_01._12_4_ = 0;
    diy_fp._12_4_ = 0;
    diy_fp.f_ = SUB128(DVar3._0_12_,0);
    diy_fp.e_ = SUB124(DVar3._0_12_,8);
    uStack_3a8 = local_3d0;
    local_3a0 = local_3c8;
    local_390 = local_3d0;
    upper_boundary.f_._0_4_ = local_3c8;
    local_3ac = CompareBufferWithDiyFp(buffer_01,local_34c._0_4_,diy_fp);
    if (local_3ac < 0) {
      buffer_local._8_8_ = dStack_368;
    }
    else if (local_3ac < 1) {
      Double::Double(&local_3e0,dStack_368);
      uVar2 = Double::Significand(&local_3e0);
      if ((uVar2 & 1) == 0) {
        buffer_local._8_8_ = dStack_368;
      }
      else {
        Double::Double(&local_3e8,dStack_368);
        buffer_local._8_8_ = Double::NextDouble(&local_3e8);
      }
    }
    else {
      Double::Double(&local_3d8,dStack_368);
      buffer_local._8_8_ = Double::NextDouble(&local_3d8);
    }
  }
  return (double)buffer_local._8_8_;
}

Assistant:

double Strtod(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) return guess;

  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}